

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void SobelToPlaneRow_C(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_y,int width)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t uVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar3 = (uint8_t)((uint)src_sobely[uVar1] + (uint)src_sobelx[uVar1]);
    if (0xfe < (uint)src_sobely[uVar1] + (uint)src_sobelx[uVar1]) {
      uVar3 = 0xff;
    }
    dst_y[uVar1] = uVar3;
  }
  return;
}

Assistant:

void SobelToPlaneRow_C(const uint8_t* src_sobelx,
                       const uint8_t* src_sobely,
                       uint8_t* dst_y,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int s = clamp255(r + b);
    dst_y[i] = (uint8_t)(s);
  }
}